

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O2

void __thiscall
glslang::HlslParseContext::fixBlockLocations
          (HlslParseContext *this,TSourceLoc *loc,TQualifier *qualifier,TTypeList *typeList,
          bool memberWithLocation,bool memberWithoutLocation)

{
  _func_int *UNRECOVERED_JUMPTABLE;
  int iVar1;
  ulong uVar2;
  undefined4 extraout_var;
  pointer pTVar4;
  ulong uVar5;
  uint uVar6;
  uint uVar7;
  long lVar3;
  
  uVar2 = *(ulong *)&qualifier->field_0x1c;
  uVar6 = (uint)uVar2;
  if ((!memberWithoutLocation || !memberWithLocation) || (~uVar6 & 0xfff) != 0) {
    if (memberWithLocation) {
      uVar7 = 0;
      if ((uVar2 & 0xff000000007fff) != 0xff000000004fff) {
        uVar2 = uVar2 | 0xfff;
        *(ulong *)&qualifier->field_0x1c = uVar2;
        if ((uVar6 & 0x7000) != 0x4000) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","component","");
          uVar2 = *(ulong *)&qualifier->field_0x1c;
        }
        uVar7 = uVar6 & 0xfff;
        if ((~uVar2 & 0xff000000000000) != 0) {
          (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                    (this,loc,"cannot apply to a block","index","");
        }
      }
      uVar6 = 0;
      while( true ) {
        uVar2 = (ulong)uVar6;
        pTVar4 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        if ((ulong)((long)(typeList->
                          super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ).
                          super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                          ._M_impl.super__Vector_impl_data._M_finish - (long)pTVar4 >> 5) <= uVar2)
        break;
        iVar1 = (*(pTVar4[uVar2].type)->_vptr_TType[10])();
        lVar3 = CONCAT44(extraout_var,iVar1);
        pTVar4 = (typeList->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                 super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        uVar5 = *(ulong *)(lVar3 + 0x1c);
        if ((~(uint)uVar5 & 0xfff) == 0) {
          if (0xffe < (int)uVar7) {
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,&pTVar4[uVar2].loc,"location is too large","location","");
            uVar5 = *(ulong *)(lVar3 + 0x1c);
          }
          uVar5 = uVar5 & 0xffffffffffff8000 | (ulong)(uVar7 & 0xfff);
          *(ulong *)(lVar3 + 0x1c) = uVar5;
          pTVar4 = (typeList->
                   super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                   super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        iVar1 = TIntermediate::computeTypeLocationSize
                          (pTVar4[uVar2].type,
                           (this->super_TParseContextBase).super_TParseVersions.language);
        uVar7 = iVar1 + ((uint)uVar5 & 0xfff);
        uVar6 = uVar6 + 1;
      }
    }
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)
            (this,loc,
             "either the block needs a location, or all members need a location, or no members have a location"
             ,"location","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void HlslParseContext::fixBlockLocations(const TSourceLoc& loc, TQualifier& qualifier, TTypeList& typeList, bool memberWithLocation, bool memberWithoutLocation)
{
    // "If a block has no block-level location layout qualifier, it is required that either all or none of its members
    // have a location layout qualifier, or a compile-time error results."
    if (! qualifier.hasLocation() && memberWithLocation && memberWithoutLocation)
        error(loc, "either the block needs a location, or all members need a location, or no members have a location", "location", "");
    else {
        if (memberWithLocation) {
            // remove any block-level location and make it per *every* member
            int nextLocation = 0;  // by the rule above, initial value is not relevant
            if (qualifier.hasAnyLocation()) {
                nextLocation = qualifier.layoutLocation;
                qualifier.layoutLocation = TQualifier::layoutLocationEnd;
                if (qualifier.hasComponent()) {
                    // "It is a compile-time error to apply the *component* qualifier to a ... block"
                    error(loc, "cannot apply to a block", "component", "");
                }
                if (qualifier.hasIndex()) {
                    error(loc, "cannot apply to a block", "index", "");
                }
            }
            for (unsigned int member = 0; member < typeList.size(); ++member) {
                TQualifier& memberQualifier = typeList[member].type->getQualifier();
                const TSourceLoc& memberLoc = typeList[member].loc;
                if (! memberQualifier.hasLocation()) {
                    if (nextLocation >= (int)TQualifier::layoutLocationEnd)
                        error(memberLoc, "location is too large", "location", "");
                    memberQualifier.layoutLocation = nextLocation;
                    memberQualifier.layoutComponent = 0;
                }
                nextLocation = memberQualifier.layoutLocation +
                               intermediate.computeTypeLocationSize(*typeList[member].type, language);
            }
        }
    }
}